

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

bool ON_FileSystemPath::PlatformPathIgnoreCase(void)

{
  return true;
}

Assistant:

bool ON_FileSystemPath::PlatformPathIgnoreCase()
{
  // 2015-June-15 Dale Lear
  //   The Windows file system ignores case.
  //
  //   Default OS X 10.10.3 installs ignore case - even the "UNIX" shell.
  //   User's can customize this setting.
  //
  //   For other OS's, devs can customize this code as they see fit.
  return true;
}